

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O1

int xlsxioread_sheet_next_row(xlsxioreadersheet sheethandle)

{
  uint uVar1;
  XML_Status XVar2;
  
  if (sheethandle == (xlsxioreadersheet)0x0) {
    return 0;
  }
  sheethandle->lastcolnr = 0;
  if (sheethandle->paddingrow == 0) {
    sheethandle->paddingcol = 0;
    do {
      XVar2 = expat_process_zip_file_resume
                        (sheethandle->zipfile,(sheethandle->processcallbackdata).xmlparser);
      if (XVar2 != XML_STATUS_SUSPENDED) break;
    } while ((sheethandle->processcallbackdata).colnr != 0);
    uVar1 = (uint)(XVar2 == XML_STATUS_SUSPENDED);
  }
  else {
    uVar1 = 3;
    if ((sheethandle->processcallbackdata).rownr <= sheethandle->paddingrow) {
      sheethandle->paddingrow = 0;
      uVar1 = 2;
    }
  }
  return uVar1;
}

Assistant:

DLL_EXPORT_XLSXIO int xlsxioread_sheet_next_row (xlsxioreadersheet sheethandle)
{
  enum XML_Status status;
  if (!sheethandle) {
    return 0;
  }
  sheethandle->lastcolnr = 0;
  //when padding rows don't retrieve new data
  if (sheethandle->paddingrow) {
    if (sheethandle->paddingrow < sheethandle->processcallbackdata.rownr) {
      return 3;
    } else {
      sheethandle->paddingrow = 0;
      return 2;
    }
  }
  sheethandle->paddingcol = 0;
  //go to beginning of next row
  while ((status = expat_process_zip_file_resume(sheethandle->zipfile, sheethandle->processcallbackdata.xmlparser)) == XML_STATUS_SUSPENDED && sheethandle->processcallbackdata.colnr != 0) {
  }
  return (status == XML_STATUS_SUSPENDED ? 1 : 0);
}